

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void gen_spr_power9_mmu(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if ((((env->spr_cb[0x1d0].name == (char *)0x0) && (env->spr[0x1d0] == 0)) &&
      (env->spr_cb[0x1d0].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x1d0].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x1d0].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x1d0].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x1d0].name = "PTCR";
    env->spr_cb[0x1d0].uea_read = spr_noaccess;
    env->spr_cb[0x1d0].uea_write = spr_noaccess;
    env->spr_cb[0x1d0].oea_read = spr_noaccess;
    env->spr_cb[0x1d0].oea_write = spr_noaccess;
    env->spr_cb[0x1d0].hea_read = spr_read_generic;
    env->spr_cb[0x1d0].hea_write = spr_write_ptcr;
    env->spr_cb[0x1d0].default_value = 0;
    env->spr[0x1d0] = 0;
    if (((env->spr_cb[0x330].name == (char *)0x0) && (env->spr[0x330] == 0)) &&
       ((env->spr_cb[0x330].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x330].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x330].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x330].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x330].name = "ASDR";
      env->spr_cb[0x330].uea_read = spr_noaccess;
      env->spr_cb[0x330].uea_write = spr_noaccess;
      env->spr_cb[0x330].oea_read = spr_noaccess;
      env->spr_cb[0x330].oea_write = spr_noaccess;
      env->spr_cb[0x330].hea_read = spr_read_generic;
      env->spr_cb[0x330].hea_write = spr_write_generic;
      env->spr_cb[0x330].default_value = 0;
      env->spr[0x330] = 0;
      return;
    }
    uVar2 = 0x330;
    uVar1 = 0x330;
  }
  else {
    uVar2 = 0x1d0;
    uVar1 = 0x1d0;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_power9_mmu(CPUPPCState *env)
{
    /* Partition Table Control */
    spr_register_kvm_hv(env, SPR_PTCR, "PTCR",
                        SPR_NOACCESS, SPR_NOACCESS,
                        SPR_NOACCESS, SPR_NOACCESS,
                        &spr_read_generic, &spr_write_ptcr,
                        KVM_REG_PPC_PTCR, 0x00000000);
    /* Address Segment Descriptor Register */
    spr_register_hv(env, SPR_ASDR, "ASDR",
                    SPR_NOACCESS, SPR_NOACCESS,
                    SPR_NOACCESS, SPR_NOACCESS,
                    &spr_read_generic, &spr_write_generic,
                    0x0000000000000000);
}